

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O0

void __thiscall
SimpleStringInternalCache::clearAllIncludingCurrentlyUsedMemory(SimpleStringInternalCache *this)

{
  ulong local_18;
  size_t i;
  SimpleStringInternalCache *this_local;
  
  for (local_18 = 0; local_18 < 5; local_18 = local_18 + 1) {
    destroySimpleStringMemoryBlockList
              (this,this->cache_[local_18].freeMemoryHead_,this->cache_[local_18].size_);
    destroySimpleStringMemoryBlockList
              (this,this->cache_[local_18].usedMemoryHead_,this->cache_[local_18].size_);
    this->cache_[local_18].freeMemoryHead_ = (SimpleStringMemoryBlock *)0x0;
    this->cache_[local_18].usedMemoryHead_ = (SimpleStringMemoryBlock *)0x0;
  }
  destroySimpleStringMemoryBlockList(this,this->nonCachedAllocations_,0);
  this->nonCachedAllocations_ = (SimpleStringMemoryBlock *)0x0;
  return;
}

Assistant:

void SimpleStringInternalCache::clearAllIncludingCurrentlyUsedMemory()
{
    for (size_t i = 0; i < amountOfInternalCacheNodes; i++) {
        destroySimpleStringMemoryBlockList(cache_[i].freeMemoryHead_, cache_[i].size_);
        destroySimpleStringMemoryBlockList(cache_[i].usedMemoryHead_, cache_[i].size_);
        cache_[i].freeMemoryHead_ = NULLPTR;
        cache_[i].usedMemoryHead_ = NULLPTR;
    }

    destroySimpleStringMemoryBlockList(nonCachedAllocations_, 0);
    nonCachedAllocations_ = NULLPTR;
}